

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_u_utf16le(zueci_u32 u,uchar *dest)

{
  uint uVar1;
  zueci_u32 v;
  zueci_u32 u2;
  uchar *dest_local;
  zueci_u32 u_local;
  int local_4;
  
  if (u < 0x10000) {
    *dest = (uchar)u;
    dest[1] = (uchar)(u >> 8);
    local_4 = 2;
  }
  else {
    uVar1 = u - 0x10000 >> 10;
    *dest = (uchar)uVar1;
    dest[1] = (char)(uVar1 >> 8) + 0xd8;
    uVar1 = u - 0x10000 & 0x3ff;
    dest[2] = (uchar)uVar1;
    dest[3] = (char)(uVar1 >> 8) + 0xdc;
    local_4 = 4;
  }
  return local_4;
}

Assistant:

static int zueci_u_utf16le(const zueci_u32 u, unsigned char *dest) {
    zueci_u32 u2, v;
    if (u < 0x10000) {
        dest[0] = (unsigned char) u;
        dest[1] = (unsigned char) (u >> 8);
        return 2;
    }
    u2 = u - 0x10000;
    v = u2 >> 10;
    dest[0] = (unsigned char) v;
    dest[1] = (unsigned char) (0xD8 + (v >> 8));
    v = u2 & 0x3FF;
    dest[2] = (unsigned char) v;
    dest[3] = (unsigned char) (0xDC + (v >> 8));
    return 4;
}